

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::create_regex_term<std::initializer_list<char_const*>>
          (string *__return_storage_ptr__,void *this,initializer_list<const_char_*> regex_piece,
          string *keyword)

{
  ostream *poVar1;
  size_t i;
  long lVar2;
  ostringstream os;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (lVar2 = 0; (long)regex_piece._M_array + -1 != lVar2; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<((ostream *)local_1a8,*(char **)((long)this + lVar2 * 8));
    std::operator<<(poVar1,(string *)regex_piece._M_len);
  }
  std::operator<<((ostream *)local_1a8,*(char **)((long)this + (long)regex_piece._M_array * 8 + -8))
  ;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string create_regex_term(T1 regex_piece, const std::string& keyword) {
    std::ostringstream os;
    for(size_t i = 0; i < regex_piece.size()-1; ++i) {
        os << std::begin(regex_piece)[i] << keyword;
    }
    os << std::begin(regex_piece)[regex_piece.size()-1];
    return os.str();
}